

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapLib.c
# Opt level: O1

Vec_Ptr_t * Amap_LibSelectGates(Amap_Lib_t *p,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  void *__s2;
  void *pvVar4;
  Amap_Gat_t *pAVar5;
  Vec_Ptr_t *pVVar6;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  
  pAVar5 = Amap_LibFindGate(p,0);
  p->pGate0 = pAVar5;
  pAVar5 = Amap_LibFindGate(p,0xffffffff);
  p->pGate1 = pAVar5;
  pAVar5 = Amap_LibFindGate(p,0xaaaaaaaa);
  p->pGateBuf = pAVar5;
  pAVar5 = Amap_LibFindGate(p,0x55555555);
  p->pGateInv = pAVar5;
  pVVar6 = (Vec_Ptr_t *)malloc(0x10);
  pVVar6->nCap = 100;
  pVVar6->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  pVVar6->pArray = ppvVar7;
  pVVar8 = p->vSorted;
  uVar12 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    uVar11 = 0;
    do {
      ppvVar7 = pVVar8->pArray;
      pvVar3 = ppvVar7[uVar11];
      __s2 = *(void **)((long)pvVar3 + 0x30);
      if ((__s2 != (void *)0x0) && (*(long *)((long)pvVar3 + 8) == 0)) {
        if (uVar11 != 0) {
          uVar10 = uVar12 & 0xffffffff;
          if ((int)uVar12 < 1) {
            uVar10 = 0;
          }
          uVar12 = 0;
          do {
            if (uVar10 == uVar12) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar4 = ppvVar7[uVar12];
            if (((*(void **)((long)pvVar4 + 0x30) != (void *)0x0) &&
                (*(long *)((long)pvVar4 + 8) == 0)) &&
               (uVar1 = *(uint *)((long)pvVar3 + 0x38),
               (uint)*(byte *)((long)pvVar4 + 0x3b) == uVar1 >> 0x18)) {
              iVar9 = 1 << ((char)(uVar1 >> 0x18) - 5U & 0x1f);
              if (uVar1 < 0x6000000) {
                iVar9 = 1;
              }
              iVar9 = bcmp(*(void **)((long)pvVar4 + 0x30),__s2,(long)iVar9 << 2);
              if (iVar9 == 0) goto LAB_00446317;
            }
            uVar12 = uVar12 + 1;
          } while (uVar11 != uVar12);
        }
        uVar1 = pVVar6->nSize;
        uVar2 = pVVar6->nCap;
        if (uVar1 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,0x80);
            }
            iVar9 = 0x10;
          }
          else {
            iVar9 = uVar2 * 2;
            if (iVar9 <= (int)uVar2) goto LAB_00446307;
            if (pVVar6->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar2 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(pVVar6->pArray,(ulong)uVar2 << 4);
            }
          }
          pVVar6->pArray = ppvVar7;
          pVVar6->nCap = iVar9;
        }
LAB_00446307:
        pVVar6->nSize = uVar1 + 1;
        pVVar6->pArray[(int)uVar1] = pvVar3;
      }
LAB_00446317:
      uVar11 = uVar11 + 1;
      pVVar8 = p->vSorted;
      uVar12 = (ulong)pVVar8->nSize;
    } while ((long)uVar11 < (long)uVar12);
  }
  return pVVar6;
}

Assistant:

Vec_Ptr_t * Amap_LibSelectGates( Amap_Lib_t * p, int fVerbose )
{
    Vec_Ptr_t * vSelect;
    Amap_Gat_t * pGate, * pGate2;
    int i, k;//, clk = Abc_Clock();
    p->pGate0   = Amap_LibFindGate( p, 0 );
    p->pGate1   = Amap_LibFindGate( p, ~0 );
    p->pGateBuf = Amap_LibFindGate( p, 0xAAAAAAAA );
    p->pGateInv = Amap_LibFindGate( p, ~0xAAAAAAAA );
    vSelect = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vSorted, pGate, i )
    {
        if ( pGate->pFunc == NULL || pGate->pTwin != NULL )
            continue;
        Vec_PtrForEachEntryStop( Amap_Gat_t *, p->vSorted, pGate2, k, i )
        {
            if ( pGate2->pFunc == NULL || pGate2->pTwin != NULL )
                continue;
            if ( pGate2->nPins != pGate->nPins )
                continue;
            if ( !memcmp( pGate2->pFunc, pGate->pFunc, sizeof(unsigned) * Abc_TruthWordNum(pGate->nPins) ) )
                break;
        }
        if ( k < i )
            continue;
        Vec_PtrPush( vSelect, pGate );            
    }
    return vSelect;
}